

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O2

void CallSignalWithoutConnections_SignalShouldBeCalled(void)

{
  signal<void_(int,_bool)> sg;
  
  TestRunner::StartTest("CallSignalWithoutConnections_SignalShouldBeCalled");
  std::make_shared<lsignal::signal<void(int,bool)>::internal_data>();
  lsignal::signal<void_(int,_bool)>::operator()(&sg,7,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sg._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void CallSignalWithoutConnections_SignalShouldBeCalled()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	sg(paramOne, paramTwo);
}